

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.h
# Opt level: O3

void __thiscall
Js::InlineCache::
OutputPropertyValueAndOperationInfo<false,false,true,(Js::CacheType)1,(Js::SlotType)1>
          (InlineCache *this,Var instance,RecyclableObject *propertyObject,PropertyId propertyId,
          Var *propertyValue,ScriptContext *requestContext,PropertyCacheOperationInfo *operationInfo
          )

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((((((propertyObject->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
      scriptContext.ptr != requestContext) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InlineCache.h"
                                ,0x183,
                                "(this->GetSourceObjectForScriptContext<cacheType>(propertyObject)->GetScriptContext() == requestContext)"
                                ,
                                "this->GetSourceObjectForScriptContext<cacheType>(propertyObject)->GetScriptContext() == requestContext"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  OutputPropertyValue<false,_false,_(Js::CacheType)1,_(Js::SlotType)1>::impl
            (this,instance,propertyObject,propertyId,propertyValue,requestContext);
  operationInfo->cacheType = CacheType_Local;
  operationInfo->slotType = SlotType_Inline;
  return;
}

Assistant:

void OutputPropertyValueAndOperationInfo(
            Var const instance,
            RecyclableObject *const propertyObject,
            const PropertyId propertyId,
            Var *const propertyValue,
            ScriptContext *const requestContext,
            PropertyCacheOperationInfo *const operationInfo)
        {
            Assert(this->GetSourceObjectForScriptContext<cacheType>(propertyObject)->GetScriptContext() == requestContext); // we never cache a type from another script context
            OutputPropertyValue<OutputExistence, IsMissing, cacheType, slotType>::impl(this, instance, propertyObject, propertyId, propertyValue, requestContext);
            OutputOperationInfo<ReturnOperationInfo>(operationInfo, cacheType, slotType);
        }